

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_def.cpp
# Opt level: O0

string * __thiscall
bidfx_public_api::price::pixie::FieldDef::ToString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDef *this)

{
  FieldTypeEnum field_type;
  FieldEncodingEnum field_encoding;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  FieldDef *local_18;
  FieldDef *this_local;
  
  local_18 = this;
  this_local = (FieldDef *)__return_storage_ptr__;
  std::__cxx11::to_string(&local_158,this->fid_);
  std::operator+(&local_138,"fieldDef(FID=",&local_158);
  std::operator+(&local_118,&local_138,", name=\"");
  std::operator+(&local_f8,&local_118,&this->name_);
  std::operator+(&local_d8,&local_f8,"\", type=");
  FieldTypeMethods::ToString_abi_cxx11_
            (&local_188,(FieldTypeMethods *)(ulong)this->type_,field_type);
  std::operator+(&local_b8,&local_d8,&local_188);
  std::operator+(&local_98,&local_b8,", encoding=");
  FieldEncodingMethods::ToString_abi_cxx11_
            (&local_1a8,(FieldEncodingMethods *)(ulong)this->encoding_,field_encoding);
  std::operator+(&local_78,&local_98,&local_1a8);
  std::operator+(&local_58,&local_78,", scale=");
  std::__cxx11::to_string(&local_1c8,this->scale_);
  std::operator+(&local_38,&local_58,&local_1c8);
  std::operator+(__return_storage_ptr__,&local_38,')');
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldDef::ToString() const
{
    return std::string("fieldDef(FID=" + std::to_string(fid_) +
                       ", name=\"" + name_ + "\", type=" + FieldTypeMethods::ToString(type_) + ", encoding="
                       + FieldEncodingMethods::ToString(encoding_) + ", scale=" + std::to_string(scale_) + ')'
    );
}